

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_MappingChannel> *a)

{
  ON_MappingChannel *this_00;
  undefined1 local_31;
  undefined1 local_21;
  undefined4 local_20;
  int iStack_1c;
  bool rc;
  int count;
  int i;
  ON_SimpleArray<ON_MappingChannel> *a_local;
  ON_BinaryArchive *this_local;
  
  local_20 = ON_SimpleArray<ON_MappingChannel>::Count(a);
  if (local_20 < 0) {
    local_20 = 0;
  }
  local_21 = WriteInt(this,local_20);
  iStack_1c = 0;
  while( true ) {
    local_31 = false;
    if (iStack_1c < local_20) {
      local_31 = local_21;
    }
    if (local_31 == false) break;
    this_00 = ON_SimpleArray<ON_MappingChannel>::operator[](a,iStack_1c);
    local_21 = ON_MappingChannel::Write(this_00,this);
    iStack_1c = iStack_1c + 1;
  }
  return local_21;
}

Assistant:

bool ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_MappingChannel>& a)
{
  int i, count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    // ON_MappingChannel::Write() puts the element in a chunk
    rc = a[i].Write(*this);
  }
  return rc;
}